

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_top(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQInteger SVar2;
  SQObject *o;
  HSQUIRRELVM v_local;
  
  pSVar1 = stack_get(v,1);
  SVar2 = SQArray::Size((pSVar1->super_SQObject)._unVal.pArray);
  if (SVar2 < 1) {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"top() on a empty array");
  }
  else {
    pSVar1 = SQArray::Top((pSVar1->super_SQObject)._unVal.pArray);
    SQVM::Push(v,pSVar1);
    v_local = (HSQUIRRELVM)0x1;
  }
  return (SQInteger)v_local;
}

Assistant:

static SQInteger array_top(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    if(_array(o)->Size()>0){
        v->Push(_array(o)->Top());
        return 1;
    }
    else return sq_throwerror(v,_SC("top() on a empty array"));
}